

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_start_rx(udp_ep *ep)

{
  nni_aio *aio;
  udp_sp_msg *puVar1;
  undefined1 local_30 [8];
  nni_iov iov;
  
  nni_msg_insert(ep->rx_payload,(void *)0x0,0x14);
  local_30 = (undefined1  [8])nni_msg_body(ep->rx_payload);
  iov.iov_buf = (void *)nni_msg_len(ep->rx_payload);
  puVar1 = (udp_sp_msg *)nni_msg_body(ep->rx_payload);
  ep->rx_msg = puVar1;
  nni_msg_trim(ep->rx_payload,0x14);
  aio = &ep->rx_aio;
  nni_aio_set_input(aio,0,&ep->rx_sa);
  nni_aio_set_iov(aio,1,(nni_iov *)local_30);
  nni_plat_udp_recv(ep->udp,aio);
  return;
}

Assistant:

static void
udp_start_rx(udp_ep *ep)
{
	nni_iov iov;

	// We use this trick to collect the message header so that we can
	// do the entire message in a single iov, which avoids the need to
	// scatter/gather (which can be problematic for platforms that cannot
	// do scatter/gather due to missing recvmsg.)
	(void) nni_msg_insert(ep->rx_payload, NULL, sizeof(udp_sp_msg));
	iov.iov_buf = nni_msg_body(ep->rx_payload);
	iov.iov_len = nni_msg_len(ep->rx_payload);
	ep->rx_msg  = nni_msg_body(ep->rx_payload);
	nni_msg_trim(ep->rx_payload, sizeof(udp_sp_msg));

	nni_aio_set_input(&ep->rx_aio, 0, &ep->rx_sa);
	nni_aio_set_iov(&ep->rx_aio, 1, &iov);
	nni_udp_recv(ep->udp, &ep->rx_aio);
}